

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_sse4.cpp
# Opt level: O3

void convertARGBToRGBA64PM_sse4<false>(QRgba64 *buffer,uint *src,int count)

{
  long lVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  QRgba64 QVar6;
  ulong uVar7;
  long lVar8;
  long in_FS_OFFSET;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar19 [16];
  undefined1 in_XMM6 [16];
  QRgba64 local_40;
  long local_38;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  auVar4 = _DAT_006be680;
  auVar3 = _DAT_006a23c0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = 0;
  if (3 < count) {
    uVar5 = 0;
    do {
      auVar19 = *(undefined1 (*) [16])(src + uVar5);
      if ((auVar3 & auVar19) == (undefined1  [16])0x0) {
        buffer[uVar5].rgba = 0;
        (buffer + uVar5)[1].rgba = 0;
        buffer[uVar5 + 2].rgba = 0;
        (buffer + uVar5 + 2)[1].rgba = 0;
      }
      else {
        auVar9 = pshufb(auVar19,auVar4);
        auVar18._0_14_ = auVar9._0_14_;
        auVar18[0xe] = auVar9[7];
        auVar18[0xf] = auVar9[7];
        auVar17._14_2_ = auVar18._14_2_;
        auVar17._0_13_ = auVar9._0_13_;
        auVar17[0xd] = auVar9[6];
        auVar16._13_3_ = auVar17._13_3_;
        auVar16._0_12_ = auVar9._0_12_;
        auVar16[0xc] = auVar9[6];
        auVar15._12_4_ = auVar16._12_4_;
        auVar15._0_11_ = auVar9._0_11_;
        auVar15[0xb] = auVar9[5];
        auVar14._11_5_ = auVar15._11_5_;
        auVar14._0_10_ = auVar9._0_10_;
        auVar14[10] = auVar9[5];
        auVar13._10_6_ = auVar14._10_6_;
        auVar13._0_9_ = auVar9._0_9_;
        auVar13[9] = auVar9[4];
        auVar12._9_7_ = auVar13._9_7_;
        auVar12._0_8_ = auVar9._0_8_;
        auVar12[8] = auVar9[4];
        auVar11._8_8_ = auVar12._8_8_;
        auVar11[7] = auVar9[3];
        auVar11[6] = auVar9[3];
        auVar11[5] = auVar9[2];
        auVar11[4] = auVar9[2];
        auVar11[3] = auVar9[1];
        auVar11[2] = auVar9[1];
        auVar11[1] = auVar9[0];
        auVar11[0] = auVar9[0];
        auVar10[1] = auVar9[8];
        auVar10[0] = auVar9[8];
        auVar10[2] = auVar9[9];
        auVar10[3] = auVar9[9];
        auVar10[4] = auVar9[10];
        auVar10[5] = auVar9[10];
        auVar10[6] = auVar9[0xb];
        auVar10[7] = auVar9[0xb];
        auVar10[8] = auVar9[0xc];
        auVar10[9] = auVar9[0xc];
        auVar10[10] = auVar9[0xd];
        auVar10[0xb] = auVar9[0xd];
        auVar10[0xc] = auVar9[0xe];
        auVar10[0xd] = auVar9[0xe];
        auVar10[0xf] = auVar9[0xf];
        auVar10[0xe] = auVar10[0xf];
        if ((auVar3 & ~auVar19) == (undefined1  [16])0x0) {
          *(undefined1 (*) [16])(buffer + uVar5) = auVar11;
          *(undefined1 (*) [16])(buffer + uVar5 + 2) = auVar10;
        }
        else {
          auVar19 = pshuflw(in_XMM5,auVar11,0xff);
          auVar19 = pshufhw(auVar19,auVar19,0xff);
          auVar19 = pmulhuw(auVar19,auVar11);
          auVar9 = pshuflw(in_XMM6,auVar10,0xff);
          auVar9 = pshufhw(auVar9,auVar9,0xff);
          in_XMM6 = pmulhuw(auVar9,auVar10);
          auVar9._0_2_ = auVar19._0_2_ - (auVar19._0_2_ >> 0xf);
          auVar9._2_2_ = auVar19._2_2_ - (auVar19._2_2_ >> 0xf);
          auVar9._4_2_ = auVar19._4_2_ - (auVar19._4_2_ >> 0xf);
          auVar9._6_2_ = auVar19._6_2_ - (auVar19._6_2_ >> 0xf);
          auVar9._8_2_ = auVar19._8_2_ - (auVar19._8_2_ >> 0xf);
          auVar9._10_2_ = auVar19._10_2_ - (auVar19._10_2_ >> 0xf);
          auVar9._12_2_ = auVar19._12_2_ - (auVar19._12_2_ >> 0xf);
          auVar9._14_2_ = auVar19._14_2_ - (auVar19._14_2_ >> 0xf);
          auVar19._0_2_ = in_XMM6._0_2_ - (in_XMM6._0_2_ >> 0xf);
          auVar19._2_2_ = in_XMM6._2_2_ - (in_XMM6._2_2_ >> 0xf);
          auVar19._4_2_ = in_XMM6._4_2_ - (in_XMM6._4_2_ >> 0xf);
          auVar19._6_2_ = in_XMM6._6_2_ - (in_XMM6._6_2_ >> 0xf);
          auVar19._8_2_ = in_XMM6._8_2_ - (in_XMM6._8_2_ >> 0xf);
          auVar19._10_2_ = in_XMM6._10_2_ - (in_XMM6._10_2_ >> 0xf);
          auVar19._12_2_ = in_XMM6._12_2_ - (in_XMM6._12_2_ >> 0xf);
          auVar19._14_2_ = in_XMM6._14_2_ - (in_XMM6._14_2_ >> 0xf);
          auVar9 = pblendw(auVar9,auVar11,0x88);
          in_XMM5 = pblendw(auVar19,auVar10,0x88);
          *(undefined1 (*) [16])(buffer + uVar5) = auVar9;
          *(undefined1 (*) [16])(buffer + uVar5 + 2) = in_XMM5;
        }
      }
      uVar5 = uVar5 + 4;
    } while (uVar5 < count - 3);
  }
  if ((int)uVar5 < count) {
    uVar5 = uVar5 & 0xffffffff;
    lVar8 = 0;
    do {
      uVar2 = src[uVar5 + lVar8];
      uVar7 = (ulong)(uVar2 >> 0x18) << 0x30 |
              CONCAT44(uVar2,uVar2 << 8 | uVar2 >> 0x10) & 0xff00ff00ff;
      local_40.rgba = uVar7 << 8 | uVar7;
      QVar6 = QRgba64::premultiplied(&local_40);
      buffer[uVar5 + lVar8].rgba = QVar6.rgba;
      if (1 < (uint)lVar8) break;
      lVar1 = uVar5 + 1 + lVar8;
      lVar8 = lVar8 + 1;
    } while (lVar1 < count);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void convertARGBToRGBA64PM_sse4(QRgba64 *buffer, const uint *src, int count)
{
    int i = 0;
    const __m128i alphaMask = _mm_set1_epi32(0xff000000);
    const __m128i rgbaMask = _mm_setr_epi8(2, 1, 0, 3, 6, 5, 4, 7, 10, 9, 8, 11, 14, 13, 12, 15);
    const __m128i shuffleMask = _mm_setr_epi8(6, 7, 6, 7, 6, 7, 6, 7, 14, 15, 14, 15, 14, 15, 14, 15);
    const __m128i zero = _mm_setzero_si128();

    for (; i < count - 3; i += 4) {
        __m128i srcVector = _mm_loadu_si128((const __m128i *)&src[i]);
        if (!_mm_testz_si128(srcVector, alphaMask)) {
            bool cf = _mm_testc_si128(srcVector, alphaMask);

            if (!RGBA)
                srcVector = _mm_shuffle_epi8(srcVector, rgbaMask);
            const __m128i src1 = _mm_unpacklo_epi8(srcVector, srcVector);
            const __m128i src2 = _mm_unpackhi_epi8(srcVector, srcVector);
            if (!cf) {
                __m128i alpha1 = _mm_shuffle_epi8(src1, shuffleMask);
                __m128i alpha2 = _mm_shuffle_epi8(src2, shuffleMask);
                __m128i dst1 = _mm_mulhi_epu16(src1, alpha1);
                __m128i dst2 = _mm_mulhi_epu16(src2, alpha2);
                // Map 0->0xfffe to 0->0xffff
                dst1 = _mm_add_epi16(dst1, _mm_srli_epi16(dst1, 15));
                dst2 = _mm_add_epi16(dst2, _mm_srli_epi16(dst2, 15));
                // correct alpha value:
                dst1 = _mm_blend_epi16(dst1, src1, 0x88);
                dst2 = _mm_blend_epi16(dst2, src2, 0x88);
                _mm_storeu_si128((__m128i *)&buffer[i], dst1);
                _mm_storeu_si128((__m128i *)&buffer[i + 2], dst2);
            } else {
                _mm_storeu_si128((__m128i *)&buffer[i], src1);
                _mm_storeu_si128((__m128i *)&buffer[i + 2], src2);
            }
        } else {
            _mm_storeu_si128((__m128i *)&buffer[i], zero);
            _mm_storeu_si128((__m128i *)&buffer[i + 2], zero);
        }
    }

    SIMD_EPILOGUE(i, count, 3) {
        const uint s = RGBA ? RGBA2ARGB(src[i]) : src[i];
        buffer[i] = QRgba64::fromArgb32(s).premultiplied();
    }
}